

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ParserResult *
Catch::clara::detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  bool bVar1;
  ParseResultType local_c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  char *local_78;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  string srcLC;
  bool *target_local;
  string *source_local;
  
  srcLC.field_2._8_8_ = target;
  ::std::__cxx11::string::string((string *)local_40,source);
  local_48 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
  local_50 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::end((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
  local_58 = (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_40);
  local_78 = (char *)::std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,Catch::clara::detail::convertInto(std::__cxx11::string_const&,bool&)::_lambda(unsigned_char)_1_>
                               (local_48,local_50,local_58);
  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_40,"y");
  if (bVar1) {
LAB_00184067:
    *(undefined1 *)srcLC.field_2._8_8_ = 1;
  }
  else {
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"1");
    if (bVar1) goto LAB_00184067;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"true");
    if (bVar1) goto LAB_00184067;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"yes");
    if (bVar1) goto LAB_00184067;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"on");
    if (bVar1) goto LAB_00184067;
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"n");
    if (!bVar1) {
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_40,"0");
      if (!bVar1) {
        bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"false");
        if (!bVar1) {
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_40,"no");
          if (!bVar1) {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_40,"off");
            if (!bVar1) {
              ::std::operator+(&local_b8,"Expected a boolean value but did not recognise: \'",source
                              );
              ::std::operator+(&local_98,&local_b8,"\'");
              BasicResult<Catch::clara::detail::ParseResultType>::runtimeError
                        (__return_storage_ptr__,&local_98);
              ::std::__cxx11::string::~string((string *)&local_98);
              ::std::__cxx11::string::~string((string *)&local_b8);
              goto LAB_001841c3;
            }
          }
        }
      }
    }
    *(undefined1 *)srcLC.field_2._8_8_ = 0;
  }
  local_c0[0] = Matched;
  BasicResult<Catch::clara::detail::ParseResultType>::ok<Catch::clara::detail::ParseResultType>
            (__return_storage_ptr__,local_c0);
LAB_001841c3:
  local_c0[1] = 1;
  ::std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline auto convertInto( std::string const &source, bool &target ) -> ParserResult {
        std::string srcLC = source;
        std::transform( srcLC.begin(), srcLC.end(), srcLC.begin(), []( unsigned char c ) { return static_cast<char>( std::tolower(c) ); } );
        if (srcLC == "y" || srcLC == "1" || srcLC == "true" || srcLC == "yes" || srcLC == "on")
            target = true;
        else if (srcLC == "n" || srcLC == "0" || srcLC == "false" || srcLC == "no" || srcLC == "off")
            target = false;
        else
            return ParserResult::runtimeError( "Expected a boolean value but did not recognise: '" + source + "'" );
        return ParserResult::ok( ParseResultType::Matched );
    }